

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O1

void duckdb::ListLambdaBindData::Serialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               ScalarFunction *param_3)

{
  optional_ptr<duckdb::FunctionData,_true> oVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_20;
  optional_ptr<duckdb::FunctionData,_true> local_18;
  
  local_18.ptr = bind_data_p.ptr;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&local_18);
  oVar1 = local_18;
  Serializer::WriteProperty<duckdb::LogicalType>
            (serializer,100,"return_type",(LogicalType *)(local_18.ptr + 1));
  local_20._M_head_impl = (Expression *)0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0x65,"lambda_expr",
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             (oVar1.ptr + 4),
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_20);
  if (local_20._M_head_impl != (Expression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  (*serializer->_vptr_Serializer[2])(serializer,0x66,"has_index");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)*(byte *)&oVar1.ptr[5]._vptr_FunctionData);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0x67,"has_initial");
  (*serializer->_vptr_Serializer[0xe])
            (serializer,(ulong)*(byte *)((long)&oVar1.ptr[5]._vptr_FunctionData + 1));
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void ListLambdaBindData::Serialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
                                   const ScalarFunction &) {
	auto &bind_data = bind_data_p->Cast<ListLambdaBindData>();
	serializer.WriteProperty(100, "return_type", bind_data.return_type);
	serializer.WritePropertyWithDefault(101, "lambda_expr", bind_data.lambda_expr, unique_ptr<Expression>());
	serializer.WriteProperty(102, "has_index", bind_data.has_index);
	serializer.WriteProperty(103, "has_initial", bind_data.has_initial);
}